

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  byte *pbVar1;
  int p1;
  Expr *pX;
  Vdbe *p;
  WhereLoop *pWVar2;
  Index *pIVar3;
  int iVar4;
  int iVar5;
  InLoop *pIVar6;
  long lVar7;
  int op;
  uint uVar8;
  
  pX = pTerm->pExpr;
  p = pParse->pVdbe;
  if (pX->op == 'L') {
    sqlite3VdbeAddOp3(p,0x1c,0,iTarget,0);
  }
  else if (pX->op == 'O') {
    iTarget = sqlite3ExprCodeTarget(pParse,pX->pRight,iTarget);
  }
  else {
    pWVar2 = pLevel->pWLoop;
    if ((((pWVar2->wsFlags & 0x400) == 0) &&
        (pIVar3 = (pWVar2->u).btree.pIndex, pIVar3 != (Index *)0x0)) &&
       (pIVar3->aSortOrder[iEq] != '\0')) {
      bRev = (int)(bRev == 0);
    }
    iVar4 = sqlite3FindInIndex(pParse,pX,4,(int *)0x0);
    uVar8 = (uint)(bRev == 0);
    if (iVar4 != 4) {
      uVar8 = bRev;
    }
    p1 = pX->iTable;
    sqlite3VdbeAddOp3(p,(uint)(uVar8 == 0) * 3 + 0x69,p1,0,0);
    pbVar1 = (byte *)((long)&pWVar2->wsFlags + 1);
    *pbVar1 = *pbVar1 | 8;
    iVar5 = (pLevel->u).in.nIn;
    if (iVar5 == 0) {
      iVar5 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
      pLevel->addrNxt = iVar5;
      iVar5 = (pLevel->u).in.nIn;
    }
    (pLevel->u).in.nIn = iVar5 + 1;
    pIVar6 = (InLoop *)
             sqlite3DbReallocOrFree(pParse->db,(pLevel->u).in.aInLoop,(long)iVar5 * 0xc + 0xc);
    (pLevel->u).in.aInLoop = pIVar6;
    if (pIVar6 == (InLoop *)0x0) {
      (pLevel->u).in.nIn = 0;
    }
    else {
      lVar7 = (long)(pLevel->u).in.nIn;
      pIVar6[lVar7 + -1].iCur = p1;
      if (iVar4 == 1) {
        op = 0x67;
        iVar4 = 0;
        iVar5 = iTarget;
      }
      else {
        op = 0x2f;
        iVar5 = 0;
        iVar4 = iTarget;
      }
      iVar4 = sqlite3VdbeAddOp3(p,op,p1,iVar5,iVar4);
      pIVar6[lVar7 + -1].addrInTop = iVar4;
      pIVar6[lVar7 + -1].eEndLoopOp = uVar8 == 0 | 6;
      sqlite3VdbeAddOp3(p,0x4c,iTarget,0,0);
    }
  }
  disableTerm(pLevel,pTerm);
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( iTarget>0 );
  if( pX->op==TK_EQ ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;
    eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0);
    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    iTab = pX->iTable;
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(v);
    }
    pLevel->u.in.nIn++;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      pIn += pLevel->u.in.nIn - 1;
      pIn->iCur = iTab;
      if( eType==IN_INDEX_ROWID ){
        pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iReg);
      }else{
        pIn->addrInTop = sqlite3VdbeAddOp3(v, OP_Column, iTab, 0, iReg);
      }
      pIn->eEndLoopOp = bRev ? OP_PrevIfOpen : OP_NextIfOpen;
      sqlite3VdbeAddOp1(v, OP_IsNull, iReg); VdbeCoverage(v);
    }else{
      pLevel->u.in.nIn = 0;
    }
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}